

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

bool __thiscall cmRST::ProcessInclude(cmRST *this,string *file,IncludeType type)

{
  ostream *os;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  cmRST r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  string local_e40;
  cmRST local_e20;
  
  if (this->IncludeDepth < 10) {
    os = this->OS;
    std::__cxx11::string::string((string *)&local_e40,(string *)&this->DocRoot);
    cmRST(&local_e20,os,&local_e40);
    std::__cxx11::string::~string((string *)&local_e40);
    local_e20.IncludeDepth = this->IncludeDepth + 1;
    local_e20.OutputLinePending = this->OutputLinePending;
    if (type != IncludeTocTree) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&local_e20.Replace._M_t,&(this->Replace)._M_t);
    }
    if (*(file->_M_dataplus)._M_p == '/') {
      std::operator+(&local_e60,&this->DocRoot,file);
      this_00 = &local_e60;
      std::__cxx11::string::operator=((string *)file,(string *)this_00);
    }
    else {
      std::operator+(&local_e80,&this->DocDir,"/");
      std::operator+(&local_e60,&local_e80,file);
      std::__cxx11::string::operator=((string *)file,(string *)&local_e60);
      std::__cxx11::string::~string((string *)&local_e60);
      this_00 = &local_e80;
    }
    std::__cxx11::string::~string((string *)this_00);
    bVar1 = ProcessFile(&local_e20,file,type == IncludeModule);
    if (type != IncludeTocTree) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&(this->Replace)._M_t,&local_e20.Replace._M_t);
    }
    this->OutputLinePending = local_e20.OutputLinePending;
    ~cmRST(&local_e20);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmRST::ProcessInclude(std::string file, IncludeType type)
{
  bool found = false;
  if (this->IncludeDepth < 10) {
    cmRST r(this->OS, this->DocRoot);
    r.IncludeDepth = this->IncludeDepth + 1;
    r.OutputLinePending = this->OutputLinePending;
    if (type != IncludeTocTree) {
      r.Replace = this->Replace;
    }
    if (file[0] == '/') {
      file = this->DocRoot + file;
    } else {
      file = this->DocDir + "/" + file;
    }
    found = r.ProcessFile(file, type == IncludeModule);
    if (type != IncludeTocTree) {
      this->Replace = r.Replace;
    }
    this->OutputLinePending = r.OutputLinePending;
  }
  return found;
}